

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O0

int Ifd_ManDsdTest33(void)

{
  int iVar1;
  int iVar2;
  Vec_Wrd_t *p;
  word local_40;
  word uTruth;
  int pCounts [6];
  int v;
  int i;
  Vec_Wrd_t *vTruths;
  int nVars;
  
  p = Ifd_ManDsdTruths(6);
  for (pCounts[5] = 0; iVar1 = pCounts[5], iVar2 = Vec_WrdSize(p), iVar1 < iVar2;
      pCounts[5] = pCounts[5] + 1) {
    local_40 = Vec_WrdEntry(p,pCounts[5]);
    Ifd_ComputeSignature(local_40,(int *)&uTruth);
    printf("%5d :  ",(ulong)(uint)pCounts[5]);
    for (pCounts[4] = 0; pCounts[4] < 6; pCounts[4] = pCounts[4] + 1) {
      printf("%2d %2d %2d   ",(ulong)(pCounts[(long)pCounts[4] + -2] >> 0x14 & 0xff),
             (ulong)(pCounts[(long)pCounts[4] + -2] >> 10 & 0xff),
             (ulong)(pCounts[(long)pCounts[4] + -2] & 0xff));
    }
    printf("  ");
    Kit_DsdPrintFromTruth((uint *)&local_40,6);
    printf("\n");
  }
  Vec_WrdFree(p);
  return 1;
}

Assistant:

int Ifd_ManDsdTest33() 
{
    int nVars = 6;
    Vec_Wrd_t * vTruths = Ifd_ManDsdTruths( nVars );
    int i, v, pCounts[6];
    word uTruth;
    Vec_WrdForEachEntry( vTruths, uTruth, i )
    {
        Ifd_ComputeSignature( uTruth, pCounts );
        // print
        printf( "%5d :  ", i ); 
        for ( v = 0; v < 6; v++ )
            printf( "%2d %2d %2d   ", (pCounts[v] >> 20) & 0xFF, (pCounts[v] >> 10) & 0xFF, (pCounts[v] >> 0) & 0xFF );
        printf( "  " );
        Kit_DsdPrintFromTruth( (unsigned *)&uTruth, nVars );
        printf( "\n" );
    }
    Vec_WrdFree( vTruths );
    return 1;
}